

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_shutdown_send(int mode)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int32_t iVar3;
  uint uVar4;
  uint32_t uVar5;
  LatencySimulator *this;
  NMQ *q;
  NMQ *q_00;
  ssize_t sVar6;
  ulong uVar7;
  char *names [3];
  uint32_t rtt;
  uint32_t ts;
  uint32_t sn;
  int32_t ret;
  uint32_t ts1;
  uint32_t cnt;
  int hr;
  char buffer [2000];
  uint local_50;
  int maxrtt;
  int count;
  int64_t sumrtt;
  uint32_t next;
  uint32_t index;
  uint32_t slap;
  uint32_t current;
  NMQ *kcp2;
  NMQ *kcp1;
  int mode_local;
  
  this = (LatencySimulator *)operator_new(0x98);
  uVar7 = 1000;
  LatencySimulator::LatencySimulator(this,0x32,0x3c,0x7d,1000);
  vnet = this;
  q = nmq_new(0x11223344,(void *)0x1);
  q_00 = nmq_new(0x11223344,(void *)0x2);
  nmq_set_output_cb(q,udp_output);
  nmq_set_output_cb(q_00,udp_output);
  nmq_set_interval(q,0x32);
  nmq_set_interval(q_00,0x32);
  nmq_set_dup_acks_limit(q,'\x02');
  nmq_set_dup_acks_limit(q_00,'\x02');
  nmq_start(q);
  nmq_start(q_00);
  iclock();
  sumrtt._4_4_ = 0;
  sumrtt._0_4_ = 0;
  local_50 = 0;
  ret = 0;
  uVar1 = iclock();
LAB_00104dd9:
  if (g_done == 0) {
    isleep(1);
    uVar5 = iclock();
    uVar2 = iclock();
    nmq_update(q,uVar2);
    uVar2 = iclock();
    nmq_update(q_00,uVar2);
    while ((uint)ret < 10 && g_done == 0) {
      cnt = sumrtt._4_4_;
      hr = uVar5;
      iVar3 = nmq_send(q,(char *)&cnt,8);
      if (0 < iVar3) {
        sumrtt._4_4_ = sumrtt._4_4_ + 1;
      }
      ret = ret + 1;
      if (ret == 10) {
        nmq_shutdown_send(q);
      }
    }
    while (g_done == 0) {
      sVar6 = LatencySimulator::recv(vnet,2,&cnt,2000,(int)uVar7);
      if ((int)sVar6 < 0) break;
      nmq_input(q_00,(char *)&cnt,(int)sVar6);
    }
    do {
      if (g_done != 0) goto LAB_00104fa1;
      sVar6 = LatencySimulator::recv(vnet,1,&cnt,2000,(int)uVar7);
      if ((int)sVar6 < 0) goto LAB_00104fa1;
      nmq_input(q,(char *)&cnt,(int)sVar6);
    } while( true );
  }
  goto LAB_00105124;
LAB_00104fa1:
  while ((g_done == 0 && (iVar3 = nmq_recv(q_00,(char *)&cnt,2000), 0 < iVar3))) {
    nmq_send(q_00,(char *)&cnt,iVar3);
  }
  while ((g_done == 0 && (iVar3 = nmq_recv(q,(char *)&cnt,2000), uVar2 = cnt, 0 < iVar3))) {
    uVar4 = uVar5 - hr;
    fprintf(_stderr,"peer: %d, outer receive sn: %u, ts: %u\n",1,(ulong)cnt,(ulong)(uint)hr);
    if (uVar2 != (uint)sumrtt) {
      fprintf(_stderr,"ERROR sn %d<->%d\n",(ulong)uVar2,(ulong)(uint)sumrtt);
      return;
    }
    sumrtt._0_4_ = (uint)sumrtt + 1;
    if (local_50 < uVar4) {
      local_50 = uVar4;
    }
    uVar7 = (ulong)uVar4;
    fprintf(_stderr,"[RECV] mode=%d sn=%d rtt=%d\n",(ulong)(uint)mode,(ulong)uVar2);
  }
  if (999 < (uint)sumrtt) {
LAB_00105124:
    uVar5 = iclock();
    nmq_destroy(q);
    nmq_destroy(q_00);
    names[0] = "normal";
    names[1] = "fast";
    printf("%s mode result (%dms):\n",names[(long)mode + -1],(ulong)(uVar5 - uVar1));
    return;
  }
  goto LAB_00104dd9;
}

Assistant:

void test_shutdown_send(int mode)
{
    // 创建模拟网络：丢包率10%，Rtt 60ms~125ms
    vnet = new LatencySimulator(50, 60, 125);

    // 创建两个端点的 kcp对象，第一个参数 conv是会话编号，同一个会话需要相同
    // 最后一个是 user参数，用来传递标识
//	NMQ *kcp1 = ikcp_create(0x11223344, (void*)0);
//	NMQ *kcp2 = ikcp_create(0x11223344, (void*)1);
    NMQ *kcp1 = nmq_new(0x11223344, (void*)1);
    NMQ *kcp2 = nmq_new(0x11223344, (void*)2);

    // 设置kcp的下层输出，这里为 udp_output，模拟udp网络输出函数
    nmq_set_output_cb(kcp1, udp_output);
    nmq_set_output_cb(kcp2, udp_output);
    nmq_set_interval(kcp1, 50);
    nmq_set_interval(kcp2, 50);
    nmq_set_dup_acks_limit(kcp1, 2);
    nmq_set_dup_acks_limit(kcp2, 2);
    nmq_start(kcp1);
    nmq_start(kcp2);

    uint32_t current = iclock();
    uint32_t slap = current + 20;
//	uint32_t slap = current;
    uint32_t index = 0;
    uint32_t next = 0;
    int64_t sumrtt = 0;
    int count = 0;
    int maxrtt = 0;

    char buffer[2000];
    int hr;
    uint32_t cnt = 0;

    uint32_t ts1 = iclock();

    while (!g_done) {
        isleep(1);
        current = iclock();
        nmq_update(kcp1, iclock());

        nmq_update(kcp2, iclock());

        while (cnt < 10 && !g_done) {
            ((uint32_t*)buffer)[0] = index;
            ((uint32_t*)buffer)[1] = current;

            // 发送上层协议包
            if (nmq_send(kcp1, buffer, 8) > 0) {
                index++;
            }
            cnt++;
            if (cnt == 10) {
                nmq_shutdown_send(kcp1);
            }
        }

        // 处理虚拟网络：检测是否有udp包从p1->p2
        while (!g_done) {
            hr = vnet->recv(2, buffer, 2000);
//            fprintf(stderr, "peer 2. read buf to peer 2. nmq_input, hr: %d\n", hr);
            if (hr < 0) break;
            // 如果 p2收到udp，则作为下层协议输入到kcp2
            nmq_input(kcp2, buffer, hr);
        }

        // 处理虚拟网络：检测是否有udp包从p2->p1
        while (!g_done) {
            hr = vnet->recv(1, buffer, 2000);
//            fprintf(stderr, "peer 1. read buf to peer 1. nmq_input, hr: %d\n", hr);
            if (hr < 0) break;
            // 如果 p1收到udp，则作为下层协议输入到kcp1
            int32_t ret =  nmq_input(kcp1, buffer, hr);
        }

        // kcp2接收到任何包都返回回去
        while (!g_done) {
            hr = nmq_recv(kcp2, buffer, 2000);
            // 没有收到包就退出
            if (hr <= 0) {
                break;
            }
            // 如果收到包就回射
            nmq_send(kcp2, buffer, hr);     // if error occurs, then data will be lost.
        }

        // kcp1收到kcp2的回射数据
        while (!g_done) {
            hr = nmq_recv(kcp1, buffer, 2000);
//            fprintf(stderr, "peer 1. nmq_recv, hr: %d\n", hr);
            // 没有收到包就退出
            if (hr <= 0) break;
            uint32_t sn = *(uint32_t*)(buffer + 0);
            uint32_t ts = *(uint32_t*)(buffer + 4);
            uint32_t rtt = current - ts;

            fprintf(stderr, "peer: %d, outer receive sn: %u, ts: %u\n", 1, sn, ts);

            if (sn != next) {
                // 如果收到的包不连续
                fprintf(stderr, "ERROR sn %d<->%d\n", (int)sn, (int)next);
                return;
            }

            next++;
            sumrtt += rtt;
            count++;
            if (rtt > (uint32_t)maxrtt) maxrtt = rtt;

            fprintf(stderr, "[RECV] mode=%d sn=%d rtt=%d\n", mode, (int)sn, (int)rtt);
        }
        if (next >= MAX_SN) break;
    }

    ts1 = iclock() - ts1;

    nmq_destroy(kcp1);
    nmq_destroy(kcp2);

    const char *names[3] = { "default", "normal", "fast" };
    printf("%s mode result (%dms):\n", names[mode], (int)ts1);
}